

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlSetUniform(int locIndex,void *value,int uniformType,int count)

{
  PFNGLUNIFORM4FVPROC UNRECOVERED_JUMPTABLE;
  
  switch(uniformType) {
  case 0:
    UNRECOVERED_JUMPTABLE = glad_glUniform1fv;
    break;
  case 1:
    UNRECOVERED_JUMPTABLE = glad_glUniform2fv;
    break;
  case 2:
    UNRECOVERED_JUMPTABLE = glad_glUniform3fv;
    break;
  case 3:
    UNRECOVERED_JUMPTABLE = glad_glUniform4fv;
    break;
  case 4:
  case 0xc:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform1iv;
    break;
  case 5:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform2iv;
    break;
  case 6:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform3iv;
    break;
  case 7:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform4iv;
    break;
  case 8:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform1uiv;
    break;
  case 9:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform2uiv;
    break;
  case 10:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform3uiv;
    break;
  case 0xb:
    UNRECOVERED_JUMPTABLE = (PFNGLUNIFORM4FVPROC)glad_glUniform4uiv;
    break;
  default:
    TraceLog(4,"SHADER: Failed to set uniform value, data type not recognized");
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(locIndex,count,(GLfloat *)value);
  return;
}

Assistant:

void rlSetUniform(int locIndex, const void *value, int uniformType, int count)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    switch (uniformType)
    {
        case RL_SHADER_UNIFORM_FLOAT: glUniform1fv(locIndex, count, (float *)value); break;
        case RL_SHADER_UNIFORM_VEC2: glUniform2fv(locIndex, count, (float *)value); break;
        case RL_SHADER_UNIFORM_VEC3: glUniform3fv(locIndex, count, (float *)value); break;
        case RL_SHADER_UNIFORM_VEC4: glUniform4fv(locIndex, count, (float *)value); break;
        case RL_SHADER_UNIFORM_INT: glUniform1iv(locIndex, count, (int *)value); break;
        case RL_SHADER_UNIFORM_IVEC2: glUniform2iv(locIndex, count, (int *)value); break;
        case RL_SHADER_UNIFORM_IVEC3: glUniform3iv(locIndex, count, (int *)value); break;
        case RL_SHADER_UNIFORM_IVEC4: glUniform4iv(locIndex, count, (int *)value); break;
    #if !defined(GRAPHICS_API_OPENGL_ES2)
        case RL_SHADER_UNIFORM_UINT: glUniform1uiv(locIndex, count, (unsigned int *)value); break;
        case RL_SHADER_UNIFORM_UIVEC2: glUniform2uiv(locIndex, count, (unsigned int *)value); break;
        case RL_SHADER_UNIFORM_UIVEC3: glUniform3uiv(locIndex, count, (unsigned int *)value); break;
        case RL_SHADER_UNIFORM_UIVEC4: glUniform4uiv(locIndex, count, (unsigned int *)value); break;
    #endif
        case RL_SHADER_UNIFORM_SAMPLER2D: glUniform1iv(locIndex, count, (int *)value); break;
        default: TRACELOG(RL_LOG_WARNING, "SHADER: Failed to set uniform value, data type not recognized");

        // TODO: Support glUniform1uiv(), glUniform2uiv(), glUniform3uiv(), glUniform4uiv()
    }
#endif
}